

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Type.h
# Opt level: O0

void __thiscall Fl_Input_Choice_Type::Fl_Input_Choice_Type(Fl_Input_Choice_Type *this)

{
  Fl_Input_Choice_Type *this_local;
  
  Fl_Menu_Type::Fl_Menu_Type(&this->super_Fl_Menu_Type);
  (this->super_Fl_Menu_Type).super_Fl_Widget_Type.super_Fl_Type._vptr_Fl_Type =
       (_func_int **)&PTR_setlabel_002e65c8;
  return;
}

Assistant:

int textstuff(int w, Fl_Font& f, int& s, Fl_Color& c) {
    Fl_Input_Choice *myo = (Fl_Input_Choice*)(w==4 ? ((Fl_Widget_Type*)this->factory)->o : this->o);
    switch (w) {
    case 4:
    case 0: f = (Fl_Font)myo->textfont(); s = myo->textsize(); c = myo->textcolor(); break;
    case 1: myo->textfont(f); break;
    case 2: myo->textsize(s); break;
    case 3: myo->textcolor(c); break;
    }
    return 1;
  }